

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weightedgraph.cpp
# Opt level: O0

UEdgeVec * libDAI::RandomDRegularGraph(size_t N,size_t d)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  size_type sVar4;
  ulong uVar5;
  pointer pUVar6;
  reference pvVar7;
  value_type in_RDX;
  ulong in_RSI;
  UEdgeVec *in_RDI;
  size_t n;
  const_iterator e;
  vector<unsigned_long,_std::allocator<unsigned_long>_> degrees;
  bool suit_pair_found;
  size_t i2;
  size_t i1;
  bool finished;
  size_t i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> U;
  size_t tries;
  bool ready;
  UEdgeVec *G;
  value_type *in_stack_fffffffffffffe58;
  vector<libDAI::UEdge,_std::allocator<libDAI::UEdge>_> *in_stack_fffffffffffffe60;
  iterator in_stack_fffffffffffffe68;
  vector<libDAI::UEdge,_std::allocator<libDAI::UEdge>_> *in_stack_fffffffffffffe70;
  iterator in_stack_fffffffffffffe78;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffe80;
  size_type in_stack_fffffffffffffe88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe90;
  byte local_151;
  byte local_141;
  size_type local_120;
  __normal_iterator<const_libDAI::UEdge_*,_std::vector<libDAI::UEdge,_std::allocator<libDAI::UEdge>_>_>
  local_100;
  undefined8 local_f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_f0;
  unsigned_long *local_d8;
  unsigned_long *local_d0;
  unsigned_long *local_c8;
  unsigned_long *local_b8;
  unsigned_long *local_b0;
  unsigned_long *local_a8;
  UEdge local_98;
  byte local_81;
  ulong local_80;
  ulong local_78;
  unsigned_long *local_70;
  unsigned_long *local_68;
  byte local_59;
  ulong local_58;
  vector<libDAI::UEdge,_std::allocator<libDAI::UEdge>_> local_40;
  long local_28;
  undefined1 local_1a;
  byte local_19;
  value_type local_18;
  ulong local_10;
  
  local_19 = 0;
  local_1a = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::vector<libDAI::UEdge,_std::allocator<libDAI::UEdge>_>::vector
            ((vector<libDAI::UEdge,_std::allocator<libDAI::UEdge>_> *)0xbacf94);
  local_28 = 0;
  do {
    if (((local_19 ^ 0xff) & 1) == 0) {
      return in_RDI;
    }
    local_28 = local_28 + 1;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xbacfd7);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    for (local_58 = 0; local_58 < local_10 * local_18; local_58 = local_58 + 1) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe70,
                 in_stack_fffffffffffffe68._M_current);
    }
    std::vector<libDAI::UEdge,_std::allocator<libDAI::UEdge>_>::clear
              ((vector<libDAI::UEdge,_std::allocator<libDAI::UEdge>_> *)0xbad073);
    local_59 = 0;
    while (((local_59 ^ 0xff) & 1) != 0) {
      local_68 = (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            in_stack_fffffffffffffe58);
      local_70 = (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            in_stack_fffffffffffffe58);
      std::
      random_shuffle<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (in_stack_fffffffffffffe80,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )in_stack_fffffffffffffe78._M_current);
      local_81 = 0;
      local_78 = 0;
      while( true ) {
        uVar5 = local_78;
        sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_40);
        local_141 = 0;
        if (uVar5 < sVar4 - 1) {
          local_141 = local_81 ^ 0xff;
        }
        sVar4 = local_78;
        if ((local_141 & 1) == 0) break;
        while( true ) {
          local_80 = sVar4 + 1;
          uVar5 = local_80;
          sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_40);
          local_151 = 0;
          if (uVar5 < sVar4) {
            local_151 = local_81 ^ 0xff;
          }
          if ((local_151 & 1) == 0) break;
          pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_40,
                              local_78);
          uVar5 = *pvVar7 / local_18;
          pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_40,
                              local_80);
          sVar4 = local_80;
          if (uVar5 != *pvVar7 / local_18) {
            local_81 = 1;
            in_stack_fffffffffffffe80._M_current = (unsigned_long *)&local_40;
            pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                in_stack_fffffffffffffe80._M_current,local_78);
            in_stack_fffffffffffffe88 = 0;
            in_stack_fffffffffffffe90 =
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(*pvVar7 / local_18);
            pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                in_stack_fffffffffffffe80._M_current,local_80);
            auVar1._8_8_ = 0;
            auVar1._0_8_ = local_18;
            auVar2._8_8_ = in_stack_fffffffffffffe88;
            auVar2._0_8_ = *pvVar7;
            UEdge::UEdge(&local_98,(size_t)in_stack_fffffffffffffe90,SUB168(auVar2 / auVar1,0));
            std::vector<libDAI::UEdge,_std::allocator<libDAI::UEdge>_>::push_back
                      (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
            in_stack_fffffffffffffe70 = &local_40;
            local_b0 = (unsigned_long *)
                       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                  in_stack_fffffffffffffe58);
            local_a8 = (unsigned_long *)
                       __gnu_cxx::
                       __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                       ::operator+(in_stack_fffffffffffffe68._M_current,
                                   (difference_type)in_stack_fffffffffffffe60);
            __gnu_cxx::
            __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
            ::__normal_iterator<unsigned_long*>
                      ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffffe60,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffffe58);
            in_stack_fffffffffffffe78 =
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::erase
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            in_stack_fffffffffffffe70,in_stack_fffffffffffffe78._M_current);
            in_stack_fffffffffffffe60 = &local_40;
            local_b8 = in_stack_fffffffffffffe78._M_current;
            local_d0 = (unsigned_long *)
                       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                  in_stack_fffffffffffffe58);
            local_c8 = (unsigned_long *)
                       __gnu_cxx::
                       __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                       ::operator+(in_stack_fffffffffffffe68._M_current,
                                   (difference_type)in_stack_fffffffffffffe60);
            __gnu_cxx::
            __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
            ::__normal_iterator<unsigned_long*>
                      ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffffe60,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffffe58);
            in_stack_fffffffffffffe68 =
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::erase
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            in_stack_fffffffffffffe70,in_stack_fffffffffffffe78._M_current);
            local_d8 = in_stack_fffffffffffffe68._M_current;
            sVar4 = local_80;
          }
        }
        local_78 = local_78 + 1;
      }
      if (((local_81 & 1) == 0) ||
         (bVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_fffffffffffffe70), bVar3)) {
        local_59 = 1;
      }
    }
    bVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_fffffffffffffe70);
    if (bVar3) {
      in_stack_fffffffffffffe58 = (value_type *)&local_f0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xbad3df);
      local_f8 = 0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                 in_stack_fffffffffffffe80._M_current);
      std::vector<libDAI::UEdge,_std::allocator<libDAI::UEdge>_>::begin
                ((vector<libDAI::UEdge,_std::allocator<libDAI::UEdge>_> *)in_stack_fffffffffffffe58)
      ;
      __gnu_cxx::
      __normal_iterator<libDAI::UEdge_const*,std::vector<libDAI::UEdge,std::allocator<libDAI::UEdge>>>
      ::__normal_iterator<libDAI::UEdge*>
                ((__normal_iterator<const_libDAI::UEdge_*,_std::vector<libDAI::UEdge,_std::allocator<libDAI::UEdge>_>_>
                  *)in_stack_fffffffffffffe60,
                 (__normal_iterator<libDAI::UEdge_*,_std::vector<libDAI::UEdge,_std::allocator<libDAI::UEdge>_>_>
                  *)in_stack_fffffffffffffe58);
      while( true ) {
        std::vector<libDAI::UEdge,_std::allocator<libDAI::UEdge>_>::end
                  ((vector<libDAI::UEdge,_std::allocator<libDAI::UEdge>_> *)
                   in_stack_fffffffffffffe58);
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_libDAI::UEdge_*,_std::vector<libDAI::UEdge,_std::allocator<libDAI::UEdge>_>_>
                            *)in_stack_fffffffffffffe60,
                           (__normal_iterator<libDAI::UEdge_*,_std::vector<libDAI::UEdge,_std::allocator<libDAI::UEdge>_>_>
                            *)in_stack_fffffffffffffe58);
        if (!bVar3) break;
        pUVar6 = __gnu_cxx::
                 __normal_iterator<const_libDAI::UEdge_*,_std::vector<libDAI::UEdge,_std::allocator<libDAI::UEdge>_>_>
                 ::operator->(&local_100);
        pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&local_f0,pUVar6->n1);
        *pvVar7 = *pvVar7 + 1;
        pUVar6 = __gnu_cxx::
                 __normal_iterator<const_libDAI::UEdge_*,_std::vector<libDAI::UEdge,_std::allocator<libDAI::UEdge>_>_>
                 ::operator->(&local_100);
        pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&local_f0,pUVar6->n2);
        *pvVar7 = *pvVar7 + 1;
        __gnu_cxx::
        __normal_iterator<const_libDAI::UEdge_*,_std::vector<libDAI::UEdge,_std::allocator<libDAI::UEdge>_>_>
        ::operator++((__normal_iterator<const_libDAI::UEdge_*,_std::vector<libDAI::UEdge,_std::allocator<libDAI::UEdge>_>_>
                      *)in_stack_fffffffffffffe68._M_current,
                     (int)((ulong)in_stack_fffffffffffffe60 >> 0x20));
      }
      local_19 = 1;
      for (local_120 = 0; local_120 < local_10; local_120 = local_120 + 1) {
        pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&local_f0,local_120);
        if (*pvVar7 != local_18) {
          local_19 = 0;
          break;
        }
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe70)
      ;
    }
    else {
      local_19 = 0;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe70);
  } while( true );
}

Assistant:

UEdgeVec RandomDRegularGraph( size_t N, size_t d ) {
        // Algorithm 1 in "Generating random regular graphs quickly"
        // by A. Steger and N.C. Wormald
        //
        // Draws a random graph with size N and uniform degree d
        // from an almost uniform probability distribution over these graphs
        // (which becomes uniform in the limit that d is small and N goes
        // to infinity).
        
        assert( (N * d) % 2 == 0 );

        bool ready = false;
        UEdgeVec G;

        size_t tries = 0;
        while( !ready ) {
            tries++;

            // Start with N*d points {0,1,...,N*d-1} (N*d even) in N groups.
            // Put U = {0,1,...,N*d-1}. (U denotes the set of unpaired points.)
            vector<size_t> U;
            U.reserve( N * d );
            for( size_t i = 0; i < N * d; i++ )
                U.push_back( i );

            // Repeat the following until no suitable pair can be found: Choose
            // two random points i and j in U, and if they are suitable, pair
            // i with j and delete i and j from U.
            G.clear();
            bool finished = false;
            while( !finished ) {
                random_shuffle( U.begin(), U.end() );
                size_t i1, i2;
                bool suit_pair_found = false;
                for( i1 = 0; i1 < U.size()-1 && !suit_pair_found; i1++ )
                    for( i2 = i1+1; i2 < U.size() && !suit_pair_found; i2++ )
                        if( (U[i1] / d) != (U[i2] / d) ) {
                            // they are suitable
                            suit_pair_found = true;
                            G.push_back( UEdge( U[i1] / d, U[i2] / d ) );
                            U.erase( U.begin() + i2 );  // first remove largest
                            U.erase( U.begin() + i1 );  // remove smallest
                        }
                if( !suit_pair_found || U.empty() )
                    finished = true;
            }

            if( U.empty() ) {
                // G is a graph with edge from vertex r to vertex s if and only if
                // there is a pair containing points in the r'th and s'th groups.
                // If G is d-regular, output, otherwise return to Step 1.

                vector<size_t> degrees;
                degrees.resize( N, 0 );
                for( UEdgeVec::const_iterator e = G.begin(); e != G.end(); e++ ) {
                    degrees[e->n1]++;
                    degrees[e->n2]++;
                }
                ready = true;
                for( size_t n = 0; n < N; n++ )
                    if( degrees[n] != d ) {
                        ready = false;
                        break;
                    }
            } else
                ready = false;
        }

        return G;
    }